

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_simulation.cpp
# Opt level: O1

void TestObservationSampling(DecPOMDPDiscrete *decpomdp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  long lVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  double dVar12;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  vector<unsigned_int,_std::allocator<unsigned_int>_> count;
  allocator_type local_89;
  ulong local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  size_t local_68;
  long local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined1 auVar13 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"jo\tja\ts\'\tP",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  lVar5 = (**(code **)(*(long *)decpomdp + 0xd0))(decpomdp);
  if (lVar5 != 0) {
    uVar9 = 0;
    do {
      local_88 = uVar9;
      lVar5 = (**(code **)(*(long *)decpomdp + 0x70))(decpomdp);
      if (lVar5 != 0) {
        uVar9 = 0;
        do {
          lVar5 = (**(code **)(*(long *)decpomdp + 0x30))(decpomdp);
          uVar8 = local_88;
          if (lVar5 != 0) {
            uVar10 = 0;
            do {
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
              dVar12 = (double)(**(code **)(*(long *)decpomdp + 0x128))
                                         (decpomdp,uVar9,uVar10,uVar8 & 0xffffffff);
              poVar6 = std::ostream::_M_insert<double>(dVar12);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
              uVar10 = (ulong)((int)uVar10 + 1);
              uVar7 = (**(code **)(*(long *)decpomdp + 0x30))(decpomdp);
            } while (uVar10 < uVar7);
          }
          uVar9 = (ulong)((int)uVar9 + 1);
          uVar8 = (**(code **)(*(long *)decpomdp + 0x70))(decpomdp);
        } while (uVar9 < uVar8);
      }
      uVar9 = (ulong)((int)local_88 + 1);
      uVar8 = (**(code **)(*(long *)decpomdp + 0xd0))(decpomdp);
    } while (uVar9 < uVar8);
  }
  uVar9 = (**(code **)(*(long *)decpomdp + 0xd0))(decpomdp);
  local_58 = (ulong)local_58._4_4_ << 0x20;
  local_88 = uVar9;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_80,(long)(int)(uint)uVar9,(value_type_conflict3 *)&local_58,&local_89);
  local_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0x100000000;
  uStack_40 = 0x100000001;
  uStack_38 = 0x100000001;
  local_68 = (uVar9 & 0xffffffff) << 2;
  uVar9 = (ulong)((uint)uVar9 & 0x7fffffff);
  lVar5 = 0;
  do {
    uVar1 = *(undefined4 *)((long)&local_58 + lVar5 * 4);
    uVar2 = (&DAT_00108140)[lVar5];
    local_60 = lVar5;
    if (0 < (int)local_88) {
      memset(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0,local_68);
    }
    iVar11 = 100000;
    do {
      uVar4 = (**(code **)(*(long *)decpomdp + 0x140))(decpomdp,uVar2,uVar1);
      auVar13._8_8_ = extraout_XMM1_Qb;
      auVar13._0_8_ = extraout_XMM1_Qa;
      local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] =
           local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar4] + 1;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
    if (0 < (int)local_88) {
      uVar8 = 0;
      do {
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," prob ",6);
    if (0 < (int)local_88) {
      uVar8 = 0;
      do {
        auVar3 = vcvtusi2sd_avx512f(auVar13,local_80.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar8]);
        poVar6 = std::ostream::_M_insert<double>(auVar3._0_8_ / 100000.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    lVar5 = local_60 + 1;
  } while (lVar5 != 10);
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TestObservationSampling(DecPOMDPDiscrete *decpomdp)
{
    cout << "jo\tja\ts'\tP"<<endl;
    for(Index jo_i = 0; jo_i < decpomdp->GetNrJointObservations(); jo_i++)
        for(Index ja_i = 0; ja_i < decpomdp->GetNrJointActions(); ja_i++)
            for(Index s_ip = 0; s_ip < decpomdp->GetNrStates(); s_ip++)
                cout << jo_i << "\t" << ja_i << "\t" << s_ip << "\t" <<
                    decpomdp->GetObservationProbability(ja_i, s_ip, jo_i) << endl;
  
    int nrJO=decpomdp->GetNrJointObservations();
    vector<Index> count(nrJO,0);
    Index states[10]={0,0,0,0,0,1,1,1,1,1};
    Index jointActions[10]={0,1,2,3,4,6,4,1,2,4};
    Index jo,si,ja;
    int nrRuns=NRRUNS;

    for(int j=0;j<10;j++)
    {
        si=states[j];
        ja=jointActions[j];
        for(int k=0;k<nrJO;k++)
            count[k]=0;

        for(int i=0;i<nrRuns;i++)
        {
            jo=decpomdp->SampleJointObservation(ja,si);
            count[jo]++;
        }
        cout << ja << "\t" << si << "\t";
        for(int k=0;k<nrJO;k++)
            cout << count[k] << "\t";
        cout << " prob ";
        for(int k=0;k<nrJO;k++)
            cout << ((double)count[k]/nrRuns) << "\t";
        cout << endl;
    }

}